

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

format_arg * __thiscall
fmt::v10::basic_format_args<fmt::v10::basic_printf_context<char>_>::get
          (format_arg *__return_storage_ptr__,
          basic_format_args<fmt::v10::basic_printf_context<char>_> *this,int id)

{
  longlong *plVar1;
  size_t sVar2;
  format_arg *pfVar3;
  long lVar4;
  ulong uVar5;
  
  __return_storage_ptr__->type_ = none_type;
  uVar5 = this->desc_;
  if ((long)uVar5 < 0) {
    if ((int)uVar5 <= id) {
      return __return_storage_ptr__;
    }
    pfVar3 = (this->field_1).args_;
    lVar4 = (long)id * 0x20;
    __return_storage_ptr__->type_ = pfVar3[id].type_;
  }
  else {
    if (0xe < id) {
      return __return_storage_ptr__;
    }
    uVar5 = uVar5 >> ((char)id * '\x04' & 0x3fU);
    __return_storage_ptr__->type_ = (type)uVar5 & custom_type;
    if ((uVar5 & 0xf) == 0) {
      return __return_storage_ptr__;
    }
    pfVar3 = (format_arg *)(this->field_1).values_;
    lVar4 = (long)id << 4;
  }
  plVar1 = (longlong *)((long)&(pfVar3->value_).field_0 + lVar4);
  sVar2 = plVar1[1];
  (__return_storage_ptr__->value_).field_0.long_long_value = *plVar1;
  (__return_storage_ptr__->value_).field_0.string.size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get(int id) const -> format_arg {
    format_arg arg;
    if (!is_packed()) {
      if (id < max_size()) arg = args_[id];
      return arg;
    }
    if (id >= detail::max_packed_args) return arg;
    arg.type_ = type(id);
    if (arg.type_ == detail::type::none_type) return arg;
    arg.value_ = values_[id];
    return arg;
  }